

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

void take_line_escaped_newline(Env *env)

{
  uint uVar1;
  int iVar2;
  _Bool _Var3;
  ulong uVar4;
  
LAB_0010a738:
  do {
    _Var3 = (*env->lexer->eof)(env->lexer);
    if ((!_Var3) &&
       (((uVar1 = env->lexer->lookahead, 0xd < uVar1 || ((0x3400U >> (uVar1 & 0x1f) & 1) == 0)) &&
        (uVar1 != 0x5c)))) {
LAB_0010a756:
      advance(env);
      goto LAB_0010a738;
    }
    if (env->lexer->lookahead != 0x5c) {
      return;
    }
    advance(env);
    iVar2 = env->lexer->lookahead;
    if ((iVar2 != 0x20) && (iVar2 != 9)) goto LAB_0010a756;
    while (uVar4 = (ulong)(uint)env->lexer->lookahead, uVar4 < 0x21) {
      if ((0x100000200U >> (uVar4 & 0x3f) & 1) == 0) {
        if ((0x3400UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_0010a756;
        break;
      }
      advance(env);
    }
  } while( true );
}

Assistant:

static void take_line_escaped_newline(Env *env) {
  for (;;) {
    while (not_eof(env) && !is_newline(PEEK) && PEEK != '\\') S_ADVANCE;
    if (PEEK == '\\') {
      S_ADVANCE;
      if (is_space_or_tab(PEEK)) {
        while (is_space_or_tab(PEEK)) S_ADVANCE;
        if (is_newline(PEEK)) S_ADVANCE;
      }
      else S_ADVANCE;
    }
    else return;
  }
}